

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gb.c
# Opt level: O2

UINT8 device_start_gameboy_sound(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  uint uVar1;
  uint uVar2;
  DEV_DATA DVar3;
  uint uVar4;
  
  DVar3.chipInf = calloc(1,0x138);
  if ((DEV_DATA *)DVar3.chipInf == (DEV_DATA *)0x0) {
    return 0xff;
  }
  uVar1 = cfg->clock;
  uVar4 = uVar1 >> 6;
  *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 8))->chipInf = uVar4;
  if (cfg->srMode == '\x02') {
    uVar2 = cfg->smplRate;
    if (cfg->smplRate <= uVar4) goto LAB_001531ed;
  }
  else {
    if (cfg->srMode != '\x01') goto LAB_001531ed;
    uVar2 = cfg->smplRate;
  }
  uVar4 = uVar2;
  *(uint *)&((DEV_DATA *)((long)DVar3.chipInf + 8))->chipInf = uVar4;
LAB_001531ed:
  *(byte *)&((DEV_DATA *)((long)DVar3.chipInf + 0x130))->chipInf = cfg->flags & 1;
  ((DEV_DATA *)((long)DVar3.chipInf + 0x120))->chipInf =
       (void *)(CONCAT44(uVar1,uVar4 >> 1) / (ulong)uVar4);
  *(void **)DVar3.chipInf = DVar3.chipInf;
  retDevInf->dataPtr = (DEV_DATA *)DVar3.chipInf;
  retDevInf->sampleRate = uVar4;
  retDevInf->devDef = &devDef;
  retDevInf->linkDevCount = 0;
  retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  return '\0';
}

Assistant:

static UINT8 device_start_gameboy_sound(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	gb_sound_t *gb;

	gb = (gb_sound_t *)calloc(1, sizeof(gb_sound_t));
	if (gb == NULL)
		return 0xFF;

	gb->rate = cfg->clock / 64;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, gb->rate, cfg->smplRate);

	gb->gbMode = (cfg->flags & 0x01) ? GBMODE_CGB04 : GBMODE_DMG;
	RC_SET_RATIO(&gb->cycleCntr, cfg->clock, gb->rate);

	gameboy_sound_set_mute_mask(gb, 0x00);
	gb->BoostWaveChn = 0x00;
	gb->NoWaveCorrupt = 0x00;
	gb->LegacyMode = 0x00;

	gb->_devData.chipInf = gb;
	INIT_DEVINF(retDevInf, &gb->_devData, gb->rate, &devDef);

	return 0x00;
}